

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.cpp
# Opt level: O0

void embree::convertHairSet(ISPCHairSet *hair,RTCScene scene_out)

{
  undefined8 uVar1;
  undefined8 in_RSI;
  long in_RDI;
  uint t;
  RTCGeometry geom;
  undefined4 local_1c;
  
  uVar1 = rtcNewGeometry(g_device,*(undefined4 *)(in_RDI + 0x48));
  for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x54); local_1c = local_1c + 1) {
    rtcSetSharedGeometryBuffer
              (uVar1,1,local_1c,0x9004,
               *(undefined8 *)(*(long *)(in_RDI + 0x18) + (ulong)local_1c * 8),0,0x10,
               *(undefined4 *)(in_RDI + 0x58));
  }
  rtcSetSharedGeometryBuffer
            (uVar1,0,0,0x5001,*(undefined8 *)(in_RDI + 0x38),0,8,*(undefined4 *)(in_RDI + 0x5c));
  if (*(long *)(in_RDI + 0x40) != 0) {
    rtcSetSharedGeometryBuffer
              (uVar1,0x20,0,0x1001,*(undefined8 *)(in_RDI + 0x40),0,1,*(undefined4 *)(in_RDI + 0x5c)
              );
  }
  rtcSetGeometryTessellationRate((float)*(uint *)(in_RDI + 100),uVar1);
  rtcSetGeometryEnableFilterFunctionFromArguments(uVar1,1);
  rtcCommitGeometry(uVar1);
  rtcAttachGeometry(in_RSI,uVar1);
  rtcReleaseGeometry(uVar1);
  return;
}

Assistant:

void convertHairSet(ISPCHairSet* hair, RTCScene scene_out)
{
  RTCGeometry geom = rtcNewGeometry (g_device, hair->type);
  for (unsigned int t=0; t<hair->numTimeSteps; t++) {
    rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_VERTEX,t,RTC_FORMAT_FLOAT4,hair->positions[t],0,sizeof(Vertex),hair->numVertices);
  }
  rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_INDEX,0,RTC_FORMAT_UINT,hair->hairs,0,sizeof(ISPCHair),hair->numHairs);
  if (hair->flags)
    rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_FLAGS,0,RTC_FORMAT_UCHAR,hair->flags,0,sizeof(char),hair->numHairs);
  rtcSetGeometryTessellationRate(geom,(float)hair->tessellation_rate);
  rtcSetGeometryEnableFilterFunctionFromArguments(geom,true);
  rtcCommitGeometry(geom);
  rtcAttachGeometry(scene_out,geom);
  rtcReleaseGeometry(geom);
}